

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int x509_name_ex_d2i(ASN1_VALUE **val,uchar **in,long len,ASN1_ITEM *it,int opt,ASN1_TLC *ctx)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  size_t sVar4;
  ASN1_VALUE *local_98;
  ASN1_VALUE *nm_val;
  ASN1_VALUE *intname_val;
  X509_NAME_ENTRY *entry;
  stack_st_X509_NAME_ENTRY *entries;
  ulong uStack_70;
  int ret;
  size_t j;
  size_t i;
  X509_NAME *nm;
  stack_st_STACK_OF_X509_NAME_ENTRY *intname;
  uchar *q;
  uchar *p;
  ASN1_TLC *ctx_local;
  ASN1_ITEM *pAStack_30;
  int opt_local;
  ASN1_ITEM *it_local;
  long len_local;
  uchar **in_local;
  ASN1_VALUE **val_local;
  
  intname = (stack_st_STACK_OF_X509_NAME_ENTRY *)*in;
  nm = (X509_NAME *)0x0;
  i = 0;
  it_local = (ASN1_ITEM *)len;
  if (0x100000 < len) {
    it_local = (ASN1_ITEM *)&testing::internal::SuiteApiResolver<testing::Test>::GetSetUpCaseOrSuite
    ;
  }
  nm_val = (ASN1_VALUE *)0x0;
  q = (uchar *)intname;
  p = (uchar *)ctx;
  ctx_local._4_4_ = opt;
  pAStack_30 = it;
  len_local = (long)in;
  in_local = (uchar **)val;
  entries._4_4_ =
       ASN1_item_ex_d2i((ASN1_VALUE **)&nm_val,&q,(long)it_local,(ASN1_ITEM *)&X509_NAME_INTERNAL_it
                        ,-1,0,(char)opt,(ASN1_TLC *)0x0);
  val_local._4_4_ = entries._4_4_;
  if (0 < entries._4_4_) {
    nm = (X509_NAME *)nm_val;
    if (*in_local != (uchar *)0x0) {
      x509_name_ex_free((ASN1_VALUE **)in_local,(ASN1_ITEM *)0x0);
    }
    local_98 = (ASN1_VALUE *)0x0;
    iVar2 = x509_name_ex_new(&local_98,(ASN1_ITEM *)0x0);
    if (iVar2 != 0) {
      i = (size_t)local_98;
      iVar2 = BUF_MEM_grow(*(BUF_MEM **)(local_98 + 0x10),(long)q - (long)intname);
      if (CONCAT44(extraout_var,iVar2) != 0) {
        OPENSSL_memcpy(*(void **)(*(long *)(i + 0x10) + 8),intname,(long)q - (long)intname);
        for (j = 0; sVar4 = j,
            sVar3 = sk_STACK_OF_X509_NAME_ENTRY_num((stack_st_STACK_OF_X509_NAME_ENTRY *)nm),
            sVar4 < sVar3; j = j + 1) {
          entry = (X509_NAME_ENTRY *)
                  sk_STACK_OF_X509_NAME_ENTRY_value((stack_st_STACK_OF_X509_NAME_ENTRY *)nm,j);
          for (uStack_70 = 0; uVar1 = uStack_70,
              sVar4 = sk_X509_NAME_ENTRY_num((stack_st_X509_NAME_ENTRY *)entry), uVar1 < sVar4;
              uStack_70 = uStack_70 + 1) {
            intname_val = (ASN1_VALUE *)
                          sk_X509_NAME_ENTRY_value((stack_st_X509_NAME_ENTRY *)entry,uStack_70);
            ((X509_NAME_ENTRY *)intname_val)->set = (int)j;
            sVar4 = sk_X509_NAME_ENTRY_push
                              (*(stack_st_X509_NAME_ENTRY **)i,(X509_NAME_ENTRY *)intname_val);
            if (sVar4 == 0) goto LAB_00408855;
            sk_X509_NAME_ENTRY_set
                      ((stack_st_X509_NAME_ENTRY *)entry,uStack_70,(X509_NAME_ENTRY *)0x0);
          }
        }
        entries._4_4_ = x509_name_canon((X509_NAME *)i);
        if (entries._4_4_ != 0) {
          sk_STACK_OF_X509_NAME_ENTRY_pop_free
                    ((stack_st_STACK_OF_X509_NAME_ENTRY *)nm,local_sk_X509_NAME_ENTRY_free);
          *(undefined4 *)(i + 8) = 0;
          *in_local = (uchar *)i;
          *(uchar **)len_local = q;
          return entries._4_4_;
        }
        entries._4_4_ = 0;
      }
    }
LAB_00408855:
    X509_NAME_free((X509_NAME *)i);
    sk_STACK_OF_X509_NAME_ENTRY_pop_free
              ((stack_st_STACK_OF_X509_NAME_ENTRY *)nm,local_sk_X509_NAME_ENTRY_pop_free);
    ERR_put_error(0xb,0,0xc,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_name.cc"
                  ,0xd3);
    val_local._4_4_ = 0;
  }
  return val_local._4_4_;
}

Assistant:

static int x509_name_ex_d2i(ASN1_VALUE **val, const unsigned char **in,
                            long len, const ASN1_ITEM *it, int opt,
                            ASN1_TLC *ctx) {
  const unsigned char *p = *in, *q;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname = NULL;
  X509_NAME *nm = NULL;
  size_t i, j;
  int ret;
  STACK_OF(X509_NAME_ENTRY) *entries;
  X509_NAME_ENTRY *entry;
  // Bound the size of an X509_NAME we are willing to parse.
  if (len > X509_NAME_MAX) {
    len = X509_NAME_MAX;
  }
  q = p;

  // Get internal representation of Name
  ASN1_VALUE *intname_val = NULL;
  ret = ASN1_item_ex_d2i(&intname_val, &p, len,
                         ASN1_ITEM_rptr(X509_NAME_INTERNAL), /*tag=*/-1,
                         /*aclass=*/0, opt, /*buf=*/NULL);
  if (ret <= 0) {
    return ret;
  }
  intname = (STACK_OF(STACK_OF_X509_NAME_ENTRY) *)intname_val;

  if (*val) {
    x509_name_ex_free(val, NULL);
  }
  ASN1_VALUE *nm_val = NULL;
  if (!x509_name_ex_new(&nm_val, NULL)) {
    goto err;
  }
  nm = (X509_NAME *)nm_val;
  // We've decoded it: now cache encoding
  if (!BUF_MEM_grow(nm->bytes, p - q)) {
    goto err;
  }
  OPENSSL_memcpy(nm->bytes->data, q, p - q);

  // Convert internal representation to X509_NAME structure
  for (i = 0; i < sk_STACK_OF_X509_NAME_ENTRY_num(intname); i++) {
    entries = sk_STACK_OF_X509_NAME_ENTRY_value(intname, i);
    for (j = 0; j < sk_X509_NAME_ENTRY_num(entries); j++) {
      entry = sk_X509_NAME_ENTRY_value(entries, j);
      entry->set = (int)i;
      if (!sk_X509_NAME_ENTRY_push(nm->entries, entry)) {
        goto err;
      }
      (void)sk_X509_NAME_ENTRY_set(entries, j, NULL);
    }
  }
  ret = x509_name_canon(nm);
  if (!ret) {
    goto err;
  }
  sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname, local_sk_X509_NAME_ENTRY_free);
  nm->modified = 0;
  *val = (ASN1_VALUE *)nm;
  *in = p;
  return ret;
err:
  X509_NAME_free(nm);
  sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                       local_sk_X509_NAME_ENTRY_pop_free);
  OPENSSL_PUT_ERROR(X509, ERR_R_ASN1_LIB);
  return 0;
}